

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

ConstTokenOrSyntax * __thiscall
slang::syntax::TimingControlStatementSyntax::getChild
          (TimingControlStatementSyntax *this,size_t index)

{
  undefined8 in_RDX;
  long in_RSI;
  ConstTokenOrSyntax *in_RDI;
  SyntaxNode *in_stack_ffffffffffffffb8;
  ConstTokenOrSyntax *in_stack_ffffffffffffffc0;
  nullptr_t in_stack_ffffffffffffffc8;
  
  switch(in_RDX) {
  case 0:
    ConstTokenOrSyntax::ConstTokenOrSyntax(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    break;
  case 1:
    ConstTokenOrSyntax::ConstTokenOrSyntax
              ((ConstTokenOrSyntax *)(in_RSI + 0x20),in_stack_ffffffffffffffb8);
    break;
  case 2:
    not_null<slang::syntax::TimingControlSyntax_*>::get
              ((not_null<slang::syntax::TimingControlSyntax_*> *)(in_RSI + 0x58));
    ConstTokenOrSyntax::ConstTokenOrSyntax(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    break;
  case 3:
    not_null<slang::syntax::StatementSyntax_*>::get
              ((not_null<slang::syntax::StatementSyntax_*> *)(in_RSI + 0x60));
    ConstTokenOrSyntax::ConstTokenOrSyntax(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    break;
  default:
    ConstTokenOrSyntax::ConstTokenOrSyntax(in_RDI,in_stack_ffffffffffffffc8);
  }
  return in_RDI;
}

Assistant:

ConstTokenOrSyntax TimingControlStatementSyntax::getChild(size_t index) const {
    switch (index) {
        case 0: return label;
        case 1: return &attributes;
        case 2: return timingControl.get();
        case 3: return statement.get();
        default: return nullptr;
    }
}